

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

int __thiscall llvm::StringRef::compare_numeric(StringRef *this,StringRef RHS)

{
  unsigned_long uVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  bool local_72;
  bool local_71;
  int Res;
  bool rd;
  bool ld;
  size_t J;
  size_t E;
  size_t I;
  StringRef *this_local;
  StringRef RHS_local;
  int local_c;
  
  RHS_local.Data = (char *)RHS.Length;
  pcVar6 = RHS.Data;
  E = 0;
  puVar5 = std::min<unsigned_long>(&this->Length,(unsigned_long *)&RHS_local);
  uVar1 = *puVar5;
  do {
    if (E == uVar1) {
      if ((char *)this->Length == RHS_local.Data) {
        RHS_local.Length._4_4_ = 0;
      }
      else {
        RHS_local.Length._4_4_ = 1;
        if ((char *)this->Length < RHS_local.Data) {
          RHS_local.Length._4_4_ = -1;
        }
      }
      return RHS_local.Length._4_4_;
    }
    bVar4 = isDigit(this->Data[E]);
    if ((bVar4) && (bVar4 = isDigit(pcVar6[E]), pcVar3 = (char *)E, bVar4)) {
      do {
        pcVar2 = pcVar3;
        _Res = pcVar2 + 1;
        if (_Res == (char *)(uVar1 + 1)) break;
        local_71 = false;
        if (_Res < (char *)this->Length) {
          local_71 = isDigit(_Res[(long)this->Data]);
        }
        local_72 = false;
        if (_Res < RHS_local.Data) {
          local_72 = isDigit(pcVar6[(long)_Res]);
        }
        if (local_71 != local_72) {
          if (local_72 == false) {
            return 1;
          }
          return -1;
        }
        pcVar3 = _Res;
      } while (local_72 != false);
      if ((long)_Res - E == 0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(this->Data + E,pcVar6 + E,(long)_Res - E);
      }
      E = (size_t)pcVar2;
      if (local_c != 0) {
        if (-1 < local_c) {
          return 1;
        }
        return -1;
      }
    }
    else if (this->Data[E] != pcVar6[E]) {
      if ((byte)pcVar6[E] <= (byte)this->Data[E]) {
        return 1;
      }
      return -1;
    }
    E = E + 1;
  } while( true );
}

Assistant:

int StringRef::compare_numeric(StringRef RHS) const {
  for (size_t I = 0, E = std::min(Length, RHS.Length); I != E; ++I) {
    // Check for sequences of digits.
    if (isDigit(Data[I]) && isDigit(RHS.Data[I])) {
      // The longer sequence of numbers is considered larger.
      // This doesn't really handle prefixed zeros well.
      size_t J;
      for (J = I + 1; J != E + 1; ++J) {
        bool ld = J < Length && isDigit(Data[J]);
        bool rd = J < RHS.Length && isDigit(RHS.Data[J]);
        if (ld != rd)
          return rd ? -1 : 1;
        if (!rd)
          break;
      }
      // The two number sequences have the same length (J-I), just memcmp them.
      if (int Res = compareMemory(Data + I, RHS.Data + I, J - I))
        return Res < 0 ? -1 : 1;
      // Identical number sequences, continue search after the numbers.
      I = J - 1;
      continue;
    }
    if (Data[I] != RHS.Data[I])
      return (unsigned char)Data[I] < (unsigned char)RHS.Data[I] ? -1 : 1;
  }
  if (Length == RHS.Length)
    return 0;
  return Length < RHS.Length ? -1 : 1;
}